

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::logProgramData
          (ShaderCompilerCase *this,BuildInfo *buildInfo,ProgramContext *progCtx)

{
  TestLog *pTVar1;
  LogShader local_f8;
  LogShader local_a8;
  LogShaderProgram local_48;
  ProgramContext *local_20;
  ProgramContext *progCtx_local;
  BuildInfo *buildInfo_local;
  ShaderCompilerCase *this_local;
  
  local_20 = progCtx;
  progCtx_local = (ProgramContext *)buildInfo;
  buildInfo_local = (BuildInfo *)this;
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::LogShaderProgram::LogShaderProgram
            (&local_48,(bool)((progCtx_local->vertShaderSource).field_0x2 & 1),
             (string *)
             &(progCtx_local->vertexAttributes).
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_48);
  tcu::LogShader::LogShader
            (&local_a8,QP_SHADER_TYPE_VERTEX,&local_20->vertShaderSource,
             (bool)((byte)(progCtx_local->vertShaderSource)._M_dataplus & 1),
             (string *)&(progCtx_local->vertShaderSource)._M_string_length);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_a8);
  tcu::LogShader::LogShader
            (&local_f8,QP_SHADER_TYPE_FRAGMENT,&local_20->fragShaderSource,
             (bool)((progCtx_local->vertShaderSource).field_0x1 & 1),
             (string *)&(progCtx_local->fragShaderSource)._M_string_length);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_f8);
  tcu::TestLog::operator<<(pTVar1,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  tcu::LogShader::~LogShader(&local_f8);
  tcu::LogShader::~LogShader(&local_a8);
  tcu::LogShaderProgram::~LogShaderProgram(&local_48);
  return;
}

Assistant:

void ShaderCompilerCase::logProgramData (const BuildInfo& buildInfo, const ProgramContext& progCtx) const
{
	m_testCtx.getLog() << TestLog::ShaderProgram(buildInfo.linkSuccess, buildInfo.logs.link)
					   << TestLog::Shader(QP_SHADER_TYPE_VERTEX,	progCtx.vertShaderSource, buildInfo.vertCompileSuccess, buildInfo.logs.vert)
					   << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT,	progCtx.fragShaderSource, buildInfo.fragCompileSuccess, buildInfo.logs.frag)
					   << TestLog::EndShaderProgram;
}